

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void quantize_row_iq3_xxs_impl(int grid_size,float *x,void *vy,int64_t n,float *quant_weights)

{
  float *pfVar1;
  uint32_t uVar2;
  char cVar3;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [14];
  undefined1 auVar12 [15];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  unkuint9 Var27;
  undefined1 auVar28 [11];
  undefined1 auVar29 [13];
  undefined1 auVar30 [14];
  undefined1 auVar31 [15];
  undefined1 auVar32 [11];
  undefined1 auVar33 [13];
  undefined1 auVar34 [14];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  uint6 uVar39;
  uint6 uVar40;
  uint32_t *grid;
  int *piVar41;
  uint16_t *puVar42;
  undefined8 *puVar43;
  int i;
  long lVar44;
  float *pfVar45;
  int iVar46;
  ushort uVar47;
  char *pcVar48;
  int i_1;
  long lVar49;
  char *pcVar50;
  int k_1;
  long lVar51;
  long lVar52;
  ulong uVar53;
  byte bVar54;
  undefined4 in_register_0000003c;
  int iVar55;
  int i_3;
  long lVar56;
  int is;
  int8_t *L_00;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  short sVar65;
  anon_union_4_2_5fd15f10 fp32;
  float fVar66;
  undefined1 auVar68 [15];
  ushort uVar79;
  ushort uVar80;
  ushort uVar82;
  ushort uVar83;
  float fVar84;
  ushort uVar86;
  ushort uVar87;
  float fVar88;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined4 uVar85;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  ushort uVar89;
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar90;
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  uint8_t block_signs [8];
  _Bool is_on_grid [8];
  _Bool is_on_grid_aux [8];
  int8_t L [32];
  int8_t Laux [32];
  uint8_t q3 [104];
  float xval [32];
  float scales [8];
  float weight [32];
  float waux [32];
  long local_358;
  uint local_348 [2];
  long local_340;
  long local_338;
  undefined8 local_330;
  float local_324;
  float local_320;
  float local_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  long local_2f0;
  long local_2e8;
  float *local_2e0;
  int64_t local_2d8;
  undefined8 *local_2d0;
  ulong local_2c8;
  long local_2c0;
  long local_2b8;
  ulong local_2b0;
  long local_2a8;
  long local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  uint local_248 [28];
  float local_1d8 [4];
  uint uStack_1c8;
  float afStack_1c4 [35];
  float local_138 [66];
  char cVar4;
  char cVar5;
  char cVar6;
  undefined6 uVar67;
  undefined1 uVar77;
  undefined1 uVar78;
  undefined1 uVar81;
  
  puVar42 = iq3_data[0].neighbours;
  piVar41 = iq3_data[0].map;
  grid = iq3_data[0].grid;
  lVar49 = CONCAT44(in_register_0000003c,grid_size);
  local_2d8 = n;
  local_2f0 = lVar49;
  if (iq3_data[0].grid == (uint32_t *)0x0) {
    pcVar50 = "kgrid_q3xs && \"forgot to call ggml_quantize_init()?\"";
    iVar46 = 0xde6;
  }
  else if (iq3_data[0].map == (int *)0x0) {
    pcVar50 = "kmap_q3xs && \"forgot to call ggml_quantize_init()?\"";
    iVar46 = 0xde7;
  }
  else if (iq3_data[0].neighbours == (uint16_t *)0x0) {
    pcVar50 = "kneighbors_q3xs && \"forgot to call ggml_quantize_init()?\"";
    iVar46 = 0xde8;
  }
  else {
    if ((char)vy == '\0') {
      local_2a8 = (long)vy >> 8;
      if (0 < (long)vy >> 8) {
        local_2d0 = (undefined8 *)((long)x + 2);
        local_2c8 = local_330;
        lVar51 = 0;
        local_2e8 = n;
        auVar104 = _DAT_0014e9a0;
        auVar99 = _DAT_0014e720;
        do {
          local_2e0 = x;
          *(ushort *)x = 0;
          local_248[0x14] = 0;
          local_248[0x15] = 0;
          local_248[0x16] = 0;
          local_248[0x17] = 0;
          local_248[0x10] = 0;
          local_248[0x11] = 0;
          local_248[0x12] = 0;
          local_248[0x13] = 0;
          local_248[0xc] = 0;
          local_248[0xd] = 0;
          local_248[0xe] = 0;
          local_248[0xf] = 0;
          local_248[8] = 0;
          local_248[9] = 0;
          local_248[10] = 0;
          local_248[0xb] = 0;
          local_248[4] = 0;
          local_248[5] = 0;
          local_248[6] = 0;
          local_248[7] = 0;
          local_248[0] = 0;
          local_248[1] = 0;
          local_248[2] = 0;
          local_248[3] = 0;
          local_248[0x18] = 0;
          local_248[0x19] = 0;
          local_2a0 = lVar51 * 0x400 + local_2f0;
          lVar44 = 0;
          auVar93 = ZEXT816(0);
          do {
            fVar90 = *(float *)(lVar49 + lVar44 * 4);
            fVar90 = auVar93._0_4_ + fVar90 * fVar90;
            auVar93._0_4_ = fVar90;
            lVar44 = lVar44 + 1;
          } while (lVar44 != 0x100);
          fVar91 = 0.0;
          local_2b8 = local_2e8;
          local_358 = 0;
          local_2c0 = lVar51;
          local_320 = (fVar90 + fVar90) * 0.00390625;
          local_340 = lVar49;
          local_338 = lVar49;
          do {
            if (local_2d8 == 0) {
              lVar49 = 0;
              do {
                pfVar45 = (float *)(local_340 + lVar49 * 4);
                fVar90 = pfVar45[1];
                fVar100 = pfVar45[2];
                fVar88 = pfVar45[3];
                local_138[lVar49] = *pfVar45 * *pfVar45;
                local_138[lVar49 + 1] = fVar90 * fVar90;
                local_138[lVar49 + 2] = fVar100 * fVar100;
                local_138[lVar49 + 3] = fVar88 * fVar88;
                lVar49 = lVar49 + 4;
              } while (lVar49 != 0x20);
            }
            else {
              lVar49 = 0;
              do {
                fVar100 = *(float *)(local_2b8 + lVar49 * 4);
                fVar90 = *(float *)(local_340 + lVar49 * 4);
                fVar90 = fVar90 * fVar90 + local_320;
                if (fVar90 < 0.0) {
                  local_308 = fVar100;
                  fVar90 = sqrtf(fVar90);
                  auVar104 = _DAT_0014e9a0;
                  auVar99 = _DAT_0014e720;
                  fVar100 = local_308;
                }
                else {
                  fVar90 = SQRT(fVar90);
                }
                local_138[lVar49] = fVar100 * fVar90;
                lVar49 = lVar49 + 1;
              } while (lVar49 != 0x20);
            }
            lVar44 = local_358 * 0x80 + local_2a0;
            lVar49 = 0;
            do {
              fVar90 = local_138[lVar49];
              if (fVar90 < 0.0) {
                fVar90 = sqrtf(fVar90);
                auVar104 = _DAT_0014e9a0;
                auVar99 = _DAT_0014e720;
              }
              else {
                fVar90 = SQRT(fVar90);
              }
              local_138[lVar49 + 0x20] = fVar90;
              lVar49 = lVar49 + 1;
            } while (lVar49 != 0x20);
            pfVar45 = local_138;
            lVar52 = 0;
            lVar49 = local_340;
            do {
              pfVar1 = (float *)(lVar44 + lVar52 * 0x20);
              fVar90 = *pfVar1;
              fVar100 = pfVar1[1];
              fVar88 = pfVar1[2];
              fVar101 = pfVar1[3];
              uVar57 = -(uint)(fVar90 < -fVar90);
              uVar59 = -(uint)(fVar100 < -fVar100);
              uVar61 = -(uint)(fVar88 < -fVar88);
              uVar63 = -(uint)(fVar101 < -fVar101);
              auVar69._0_8_ = CONCAT44(uVar59,uVar57);
              auVar69._8_4_ = uVar61;
              auVar69._12_4_ = uVar63;
              auVar92._8_4_ = uVar61;
              auVar92._0_8_ = auVar69._0_8_;
              auVar92._12_4_ = uVar63;
              auVar93 = packssdw(auVar92,auVar69);
              auVar93 = packsswb(auVar93,auVar93);
              auVar69 = auVar69 & _DAT_0014e930;
              local_1d8[lVar52 * 8] = (float)((uint)-fVar90 & uVar57 | ~uVar57 & (uint)fVar90);
              local_1d8[lVar52 * 8 + 1] = (float)((uint)-fVar100 & uVar59 | ~uVar59 & (uint)fVar100)
              ;
              local_1d8[lVar52 * 8 + 2] = (float)((uint)-fVar88 & uVar61 | ~uVar61 & (uint)fVar88);
              local_1d8[lVar52 * 8 + 3] = (float)((uint)-fVar101 & uVar63 | ~uVar63 & (uint)fVar101)
              ;
              pfVar1 = (float *)(lVar44 + 0x10 + lVar52 * 0x20);
              fVar90 = *pfVar1;
              fVar100 = pfVar1[1];
              fVar88 = pfVar1[2];
              fVar101 = pfVar1[3];
              uVar57 = (uint)(fVar90 < -fVar90);
              uVar58 = -uVar57;
              uVar59 = (uint)(fVar100 < -fVar100);
              uVar60 = -uVar59;
              uVar61 = (uint)(fVar88 < -fVar88);
              uVar62 = -uVar61;
              uVar63 = (uint)(fVar101 < -fVar101);
              uVar64 = -uVar63;
              auVar105._4_4_ = uVar60;
              auVar105._0_4_ = uVar58;
              auVar105._8_4_ = uVar62;
              auVar105._12_4_ = uVar64;
              auVar106 = packssdw(auVar105,auVar105);
              auVar106 = packsswb(auVar106,auVar106);
              auVar93 = auVar106 & _DAT_0014e8d0 | auVar93 & _DAT_0014e8c0;
              *(uint *)((long)afStack_1c4 + (lVar52 * 8 + -1) * 4) =
                   (uint)-fVar90 & uVar58 | ~uVar58 & (uint)fVar90;
              local_1d8[lVar52 * 8 + 5] = (float)((uint)-fVar100 & uVar60 | ~uVar60 & (uint)fVar100)
              ;
              local_1d8[lVar52 * 8 + 6] = (float)((uint)-fVar88 & uVar62 | ~uVar62 & (uint)fVar88);
              local_1d8[lVar52 * 8 + 7] = (float)((uint)-fVar101 & uVar64 | ~uVar64 & (uint)fVar101)
              ;
              auVar106._0_4_ = auVar93._0_4_ >> 0x10;
              auVar106._4_4_ = 0;
              auVar106._8_4_ = auVar93._8_4_ >> 0x10;
              auVar106._12_4_ = auVar93._12_4_ >> 0x10;
              bVar54 = SUB161(auVar106 | auVar93,1) | SUB161(auVar106 | auVar93,0);
              if ((auVar69._12_4_ + uVar63 + auVar69._4_4_ + uVar59 +
                   auVar69._8_4_ + uVar61 + auVar69._0_4_ + uVar57 & 1) != 0) {
                fVar90 = *(float *)(lVar44 + lVar52 * 0x20);
                iVar46 = 0;
                lVar56 = 1;
                fVar90 = local_138[lVar52 * 8] * fVar90 * fVar90;
                do {
                  fVar100 = *(float *)(lVar49 + lVar56 * 4);
                  fVar100 = pfVar45[lVar56] * fVar100 * fVar100;
                  iVar55 = (int)lVar56;
                  if (fVar90 <= fVar100) {
                    fVar100 = fVar90;
                    iVar55 = iVar46;
                  }
                  iVar46 = iVar55;
                  lVar56 = lVar56 + 1;
                  fVar90 = fVar100;
                } while (lVar56 != 8);
                iVar55 = (int)lVar52 * 8 + iVar46;
                local_1d8[iVar55] = (float)((uint)local_1d8[iVar55] ^ (uint)DAT_0014a080);
                bVar54 = bVar54 ^ (byte)(1 << ((byte)iVar46 & 0x1f));
              }
              *(byte *)((long)local_348 + lVar52) = bVar54 & 0x7f;
              lVar52 = lVar52 + 1;
              lVar49 = lVar49 + 0x20;
              pfVar45 = pfVar45 + 8;
            } while (lVar52 != 4);
            lVar49 = 1;
            fVar90 = local_1d8[0];
            do {
              if (fVar90 <= local_1d8[lVar49]) {
                fVar90 = local_1d8[lVar49];
              }
              lVar49 = lVar49 + 1;
            } while (lVar49 != 0x20);
            if (1e-08 <= fVar90) {
              _local_318 = ZEXT416((uint)(fVar90 / 15.0));
              _local_278 = ZEXT812(0);
              fStack_26c = 0.0;
              iVar46 = -0xf;
              local_324 = fVar90;
              do {
                fVar101 = ((float)iVar46 * 0.2 + 15.0) / local_324;
                local_31c = 1.0 / fVar101;
                pcVar50 = (char *)&local_268;
                lVar49 = 0;
                local_308 = fVar101;
                fStack_304 = fVar101;
                fStack_300 = fVar101;
                fStack_2fc = fVar101;
                fVar90 = fVar101;
                fVar100 = fVar101;
                fVar88 = fVar101;
                do {
                  fVar66 = (local_1d8[lVar49 * 4] * fVar101 + -1.0) * 0.5 + 12582912.0;
                  fVar84 = (local_1d8[lVar49 * 4 + 1] * fVar90 + -1.0) * 0.5 + 12582912.0;
                  auVar70._0_8_ = CONCAT44(fVar84,fVar66) & 0x7fffff007fffff;
                  auVar70._8_4_ =
                       (uint)((local_1d8[lVar49 * 4 + 2] * fVar100 + -1.0) * 0.5 + 12582912.0) &
                       0x7fffff;
                  auVar70._12_4_ =
                       (uint)((local_1d8[lVar49 * 4 + 3] * fVar88 + -1.0) * 0.5 + 12582912.0) &
                       0x7fffff;
                  auVar94._0_4_ = -(uint)((int)((uint)fVar66 & 0x7fffff) < auVar104._0_4_);
                  auVar94._4_4_ = -(uint)((int)((uint)fVar84 & 0x7fffff) < auVar104._4_4_);
                  auVar94._8_4_ = -(uint)((int)auVar70._8_4_ < auVar104._8_4_);
                  auVar94._12_4_ = -(uint)((int)auVar70._12_4_ < auVar104._12_4_);
                  auVar93 = ~auVar94 & auVar104 | auVar70 & auVar94;
                  auVar71._0_4_ = -(uint)(0x400000 < auVar93._0_4_);
                  auVar71._4_4_ = -(uint)(0x400000 < auVar93._4_4_);
                  auVar71._8_4_ = -(uint)(0x400000 < auVar93._8_4_);
                  auVar71._12_4_ = -(uint)(0x400000 < auVar93._12_4_);
                  auVar93 = auVar71 & auVar93 & auVar99;
                  sVar7 = auVar93._0_2_;
                  cVar3 = (0 < sVar7) * (sVar7 < 0x100) * auVar93[0] - (0xff < sVar7);
                  sVar7 = auVar93._2_2_;
                  sVar65 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar93[2] - (0xff < sVar7),
                                    cVar3);
                  sVar7 = auVar93._4_2_;
                  cVar4 = (0 < sVar7) * (sVar7 < 0x100) * auVar93[4] - (0xff < sVar7);
                  sVar7 = auVar93._6_2_;
                  uVar85 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar93[6] - (0xff < sVar7),
                                    CONCAT12(cVar4,sVar65));
                  sVar7 = auVar93._8_2_;
                  cVar5 = (0 < sVar7) * (sVar7 < 0x100) * auVar93[8] - (0xff < sVar7);
                  sVar7 = auVar93._10_2_;
                  uVar67 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar93[10] - (0xff < sVar7),
                                    CONCAT14(cVar5,uVar85));
                  sVar7 = auVar93._12_2_;
                  cVar6 = (0 < sVar7) * (sVar7 < 0x100) * auVar93[0xc] - (0xff < sVar7);
                  sVar9 = auVar93._14_2_;
                  sVar7 = (short)((uint)uVar85 >> 0x10);
                  sVar8 = (short)((uint6)uVar67 >> 0x20);
                  sVar9 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar93[0xe] -
                                           (0xff < sVar9),CONCAT16(cVar6,uVar67)) >> 0x30);
                  *(uint *)((long)&local_268 + lVar49 * 4) =
                       CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                                CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                         CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar4 -
                                                  (0xff < sVar7),
                                                  (0 < sVar65) * (sVar65 < 0x100) * cVar3 -
                                                  (0xff < sVar65))));
                  lVar51 = 0;
                  uVar53 = 0;
                  pcVar48 = pcVar50;
                  do {
                    uVar53 = (ulong)((uint)uVar53 | (int)*pcVar48 << ((byte)lVar51 & 0x1f));
                    lVar51 = lVar51 + 3;
                    pcVar48 = pcVar48 + 1;
                  } while (lVar51 != 0xc);
                  iVar55 = piVar41[uVar53 & 0xffff];
                  *(undefined1 *)((long)&local_2b0 + lVar49) = 1;
                  if ((long)iVar55 < 0) {
                    *(undefined1 *)((long)&local_2b0 + lVar49) = 0;
                    iq3_find_best_neighbour
                              (puVar42 + (-1 - (long)iVar55),grid,local_1d8 + lVar49 * 4,
                               local_138 + lVar49 * 4 + 0x20,local_31c,
                               (int8_t *)((long)&local_268 + lVar49 * 4));
                    auVar104 = _DAT_0014e9a0;
                    auVar99 = _DAT_0014e720;
                    fVar101 = local_308;
                    fVar90 = fStack_304;
                    fVar100 = fStack_300;
                    fVar88 = fStack_2fc;
                  }
                  lVar49 = lVar49 + 1;
                  pcVar50 = pcVar50 + 4;
                } while (lVar49 != 8);
                fVar90 = 0.0;
                fVar100 = 0.0;
                fVar88 = 0.0;
                fVar101 = 0.0;
                lVar49 = 0;
                do {
                  fVar84 = (float)(*(char *)((long)&local_268 + lVar49) * 2 + 1);
                  fVar66 = local_138[lVar49];
                  fVar90 = fVar90 + fVar84 * local_1d8[lVar49] * fVar66;
                  fVar100 = fVar100 + fVar84 * fVar84 * fVar66;
                  fVar88 = fVar88 + fVar84 * fVar66 * 0.0;
                  fVar101 = fVar101 + fVar84 * fVar66 * 0.0;
                  lVar49 = lVar49 + 1;
                } while (lVar49 != 0x20);
                if ((0.0 < fVar100) && ((float)local_278._0_4_ * fVar100 < fVar90 * fVar90)) {
                  local_288 = local_258;
                  uStack_280 = uStack_250;
                  local_298 = local_268;
                  uStack_290 = uStack_260;
                  local_2c8 = local_2b0;
                  local_318._4_4_ = fVar100;
                  local_318._0_4_ = fVar90 / fVar100;
                  fStack_310 = fVar88;
                  fStack_30c = fVar101;
                  local_278._4_4_ = fVar100;
                  local_278._0_4_ = fVar90 * (fVar90 / fVar100);
                  fStack_270 = fVar88;
                  fStack_26c = fVar101;
                }
                iVar46 = iVar46 + 1;
              } while (iVar46 != 0x10);
              local_330 = local_2c8;
              uVar53 = local_330;
              auVar68._8_7_ = 0;
              auVar68._0_8_ = local_2c8;
              auVar68 = auVar68 ^ DAT_0014e6a0._0_15_;
              auVar12[0xd] = 0;
              auVar12._0_13_ = auVar68._0_13_;
              auVar12[0xe] = auVar68[7];
              auVar15[0xc] = auVar68[6];
              auVar15._0_12_ = auVar68._0_12_;
              auVar15._13_2_ = auVar12._13_2_;
              auVar17[0xb] = 0;
              auVar17._0_11_ = auVar68._0_11_;
              auVar17._12_3_ = auVar15._12_3_;
              auVar19[10] = auVar68[5];
              auVar19._0_10_ = auVar68._0_10_;
              auVar19._11_4_ = auVar17._11_4_;
              auVar21[9] = 0;
              auVar21._0_9_ = auVar68._0_9_;
              auVar21._10_5_ = auVar19._10_5_;
              auVar23[8] = auVar68[4];
              auVar23._0_8_ = auVar68._0_8_;
              auVar23._9_6_ = auVar21._9_6_;
              auVar26._7_8_ = 0;
              auVar26._0_7_ = auVar23._8_7_;
              Var27 = CONCAT81(SUB158(auVar26 << 0x40,7),auVar68[3]);
              auVar35._9_6_ = 0;
              auVar35._0_9_ = Var27;
              auVar28._1_10_ = SUB1510(auVar35 << 0x30,5);
              auVar28[0] = auVar68[2];
              auVar36._11_4_ = 0;
              auVar36._0_11_ = auVar28;
              auVar29._1_12_ = SUB1512(auVar36 << 0x20,3);
              auVar29[0] = auVar68[1];
              uVar47 = CONCAT11(0,auVar68[0]);
              auVar25._2_13_ = auVar29;
              auVar25._0_2_ = uVar47;
              auVar13._10_2_ = 0;
              auVar13._0_10_ = auVar25._0_10_;
              auVar13._12_2_ = (short)Var27;
              uVar39 = CONCAT42(auVar13._10_4_,auVar28._0_2_);
              auVar30._6_8_ = 0;
              auVar30._0_6_ = uVar39;
              local_330._4_4_ = (uint)(local_2c8 >> 0x20);
              auVar68 = ZEXT415(local_330._4_4_) ^ DAT_0014e6a0._0_15_;
              auVar10[0xd] = 0;
              auVar10._0_13_ = auVar68._0_13_;
              auVar10[0xe] = auVar68[7];
              auVar14[0xc] = auVar68[6];
              auVar14._0_12_ = auVar68._0_12_;
              auVar14._13_2_ = auVar10._13_2_;
              auVar16[0xb] = 0;
              auVar16._0_11_ = auVar68._0_11_;
              auVar16._12_3_ = auVar14._12_3_;
              auVar18[10] = auVar68[5];
              auVar18._0_10_ = auVar68._0_10_;
              auVar18._11_4_ = auVar16._11_4_;
              auVar20[9] = 0;
              auVar20._0_9_ = auVar68._0_9_;
              auVar20._10_5_ = auVar18._10_5_;
              auVar22[8] = auVar68[4];
              auVar22._0_8_ = auVar68._0_8_;
              auVar22._9_6_ = auVar20._9_6_;
              auVar31._7_8_ = 0;
              auVar31._0_7_ = auVar22._8_7_;
              Var27 = CONCAT81(SUB158(auVar31 << 0x40,7),auVar68[3]);
              auVar37._9_6_ = 0;
              auVar37._0_9_ = Var27;
              auVar32._1_10_ = SUB1510(auVar37 << 0x30,5);
              auVar32[0] = auVar68[2];
              auVar38._11_4_ = 0;
              auVar38._0_11_ = auVar32;
              auVar33._1_12_ = SUB1512(auVar38 << 0x20,3);
              auVar33[0] = auVar68[1];
              uVar89 = CONCAT11(0,auVar68[0]);
              auVar24._2_13_ = auVar33;
              auVar24._0_2_ = uVar89;
              auVar11._10_2_ = 0;
              auVar11._0_10_ = auVar24._0_10_;
              auVar11._12_2_ = (short)Var27;
              uVar40 = CONCAT42(auVar11._10_4_,auVar32._0_2_);
              auVar34._6_8_ = 0;
              auVar34._0_6_ = uVar40;
              auVar93 = _local_318;
              local_330 = uVar53;
              if (((auVar11._10_4_ >> 0x10) + (auVar13._10_4_ >> 0x10) +
                   (int)CONCAT82(SUB148(auVar34 << 0x40,6),auVar33._0_2_) +
                   (int)CONCAT82(SUB148(auVar30 << 0x40,6),auVar29._0_2_) +
                   (int)uVar40 + (int)uVar39 + (uint)uVar89 + (uint)uVar47 != 0) &&
                 (0.0 < local_318._0_4_)) {
                fVar101 = 1.0 / local_318._0_4_;
                lVar49 = 0;
                L_00 = (int8_t *)&local_298;
                pcVar50 = (char *)&local_330;
                local_308 = fVar101;
                fStack_304 = fVar101;
                fStack_300 = fVar101;
                fStack_2fc = fVar101;
                fVar90 = fVar101;
                fVar100 = fVar101;
                fVar88 = fVar101;
                do {
                  if (*pcVar50 == '\0') {
                    fVar66 = (*(float *)((long)local_1d8 + lVar49) * fVar101 + -1.0) * 0.5 +
                             12582912.0;
                    fVar84 = (*(float *)((long)local_1d8 + lVar49 + 4) * fVar90 + -1.0) * 0.5 +
                             12582912.0;
                    auVar72._0_8_ = CONCAT44(fVar84,fVar66) & 0x7fffff007fffff;
                    auVar72._8_4_ =
                         (uint)((*(float *)((long)local_1d8 + lVar49 + 8) * fVar100 + -1.0) * 0.5 +
                               12582912.0) & 0x7fffff;
                    auVar72._12_4_ =
                         (uint)((*(float *)((long)local_1d8 + lVar49 + 0xc) * fVar88 + -1.0) * 0.5 +
                               12582912.0) & 0x7fffff;
                    auVar95._0_4_ = -(uint)((int)((uint)fVar66 & 0x7fffff) < auVar104._0_4_);
                    auVar95._4_4_ = -(uint)((int)((uint)fVar84 & 0x7fffff) < auVar104._4_4_);
                    auVar95._8_4_ = -(uint)((int)auVar72._8_4_ < auVar104._8_4_);
                    auVar95._12_4_ = -(uint)((int)auVar72._12_4_ < auVar104._12_4_);
                    auVar93 = ~auVar95 & auVar104 | auVar72 & auVar95;
                    auVar73._0_4_ = -(uint)(0x400000 < auVar93._0_4_);
                    auVar73._4_4_ = -(uint)(0x400000 < auVar93._4_4_);
                    auVar73._8_4_ = -(uint)(0x400000 < auVar93._8_4_);
                    auVar73._12_4_ = -(uint)(0x400000 < auVar93._12_4_);
                    auVar93 = pshuflw(auVar73 & auVar93,auVar73 & auVar93,0xe8);
                    auVar93 = pshufhw(auVar93,auVar93,0xe8);
                    auVar74._0_8_ =
                         CONCAT26(auVar93._10_2_ * 0x200,
                                  CONCAT24(auVar93._8_2_ * 0x40,
                                           CONCAT22(auVar93._2_2_ * 8,auVar93._0_2_)));
                    auVar74._8_8_ = 0;
                    uVar85 = (undefined4)(auVar74._0_8_ >> 0x20);
                    auVar96._4_4_ = uVar85;
                    auVar96._0_4_ = uVar85;
                    auVar96._8_4_ = uVar85;
                    auVar96._12_4_ = uVar85;
                    uVar57 = piVar41[(ushort)(SUB162(auVar96 | auVar74,2) |
                                             SUB162(auVar96 | auVar74,0))];
                    if ((long)(int)uVar57 < 0) {
                      uVar57 = iq3_find_best_neighbour
                                         (puVar42 + (-1 - (long)(int)uVar57),grid,
                                          (float *)((long)local_1d8 + lVar49),
                                          (float *)((long)local_138 + lVar49 + 0x80),
                                          (float)local_318._0_4_,L_00);
                      auVar104 = _DAT_0014e9a0;
                      auVar99 = _DAT_0014e720;
                      fVar101 = local_308;
                      fVar90 = fStack_304;
                      fVar100 = fStack_300;
                      fVar88 = fStack_2fc;
                    }
                    uVar2 = grid[uVar57];
                    uVar81 = (undefined1)(uVar2 >> 0x18);
                    uVar78 = (undefined1)(uVar2 >> 0x10);
                    uVar77 = (undefined1)(uVar2 >> 8);
                    auVar75._4_4_ =
                         (int)(CONCAT35(CONCAT21(CONCAT11(uVar81,uVar81),uVar78),
                                        CONCAT14(uVar78,uVar2)) >> 0x20);
                    auVar75[3] = uVar77;
                    auVar75[2] = uVar77;
                    auVar75[0] = (undefined1)uVar2;
                    auVar75[1] = auVar75[0];
                    auVar75._8_8_ = 0;
                    auVar93 = psraw(auVar75,8);
                    auVar76._0_2_ = auVar93._0_2_ - 1;
                    auVar76._2_2_ = auVar93._2_2_ - 1;
                    auVar76._4_2_ = auVar93._4_2_ - 1;
                    auVar76._6_2_ = auVar93._6_2_ - 1;
                    auVar76._8_2_ = auVar93._8_2_ - 1;
                    auVar76._10_2_ = auVar93._10_2_ - 1;
                    auVar76._12_2_ = auVar93._12_2_ - 1;
                    auVar76._14_2_ = auVar93._14_2_ - 1;
                    auVar97._0_2_ = auVar76._0_2_ >> 0xf;
                    auVar97._2_2_ = auVar76._2_2_ >> 0xf;
                    auVar97._4_2_ = auVar76._4_2_ >> 0xf;
                    auVar97._6_2_ = auVar76._6_2_ >> 0xf;
                    auVar97._8_2_ = auVar76._8_2_ >> 0xf;
                    auVar97._10_2_ = auVar76._10_2_ >> 0xf;
                    auVar97._12_2_ = auVar76._12_2_ >> 0xf;
                    auVar97._14_2_ = auVar76._14_2_ >> 0xf;
                    auVar97 = auVar97 & auVar76;
                    uVar47 = (auVar76._0_2_ >> 1) + auVar97._0_2_;
                    uVar79 = (auVar76._2_2_ >> 1) + auVar97._2_2_;
                    uVar82 = (auVar76._4_2_ >> 1) + auVar97._4_2_;
                    uVar86 = (auVar76._6_2_ >> 1) + auVar97._6_2_;
                    uVar89 = uVar47 & 0xff;
                    uVar80 = uVar79 & 0xff;
                    uVar83 = uVar82 & 0xff;
                    uVar87 = uVar86 & 0xff;
                    *(uint *)L_00 =
                         CONCAT13((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar86 - (0xff < uVar87),
                                  CONCAT12((uVar83 != 0) * (uVar83 < 0x100) * (char)uVar82 -
                                           (0xff < uVar83),
                                           CONCAT11((uVar80 != 0) * (uVar80 < 0x100) * (char)uVar79
                                                    - (0xff < uVar80),
                                                    (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar47
                                                    - (0xff < uVar89))));
                  }
                  pcVar50 = pcVar50 + 1;
                  L_00 = L_00 + 4;
                  lVar49 = lVar49 + 0x10;
                } while (lVar49 != 0x80);
                fVar90 = 0.0;
                fVar100 = 0.0;
                lVar49 = 0;
                do {
                  fVar88 = (float)(*(char *)((long)&local_298 + lVar49) * 2 + 1);
                  fVar90 = fVar90 + fVar88 * fVar88 * local_138[lVar49];
                  fVar100 = fVar100 + fVar88 * local_1d8[lVar49] * local_138[lVar49];
                  lVar49 = lVar49 + 1;
                } while (lVar49 != 0x20);
                auVar102._0_4_ = ~-(uint)(0.0 < fVar90) & local_318._0_4_;
                auVar102._4_4_ = local_318._4_4_;
                auVar102._8_4_ = fStack_310;
                auVar102._12_4_ = fStack_30c;
                auVar93 = auVar102 | ZEXT416((uint)(fVar100 / fVar90) & -(uint)(0.0 < fVar90));
              }
              auVar98 = auVar93;
              if (auVar93._0_4_ < 0.0) {
                local_348[0] = ~local_348[0] & 0x7f7f7f7f;
                auVar98._0_4_ = -auVar93._0_4_;
                auVar98._4_4_ = 0;
                auVar98._8_4_ = auVar93._8_4_ ^ 0x80000000;
                auVar98._12_4_ = auVar93._12_4_ ^ 0x80000000;
              }
              pcVar50 = (char *)&local_298;
              lVar49 = 0;
              do {
                lVar51 = 0;
                uVar53 = 0;
                pcVar48 = pcVar50;
                do {
                  uVar57 = (int)*pcVar48 << ((byte)lVar51 & 0x1f);
                  quant_weights = (float *)(ulong)uVar57;
                  uVar53 = (ulong)((uint)uVar53 | uVar57);
                  lVar51 = lVar51 + 3;
                  pcVar48 = pcVar48 + 1;
                } while (lVar51 != 0xc);
                if (piVar41[uVar53 & 0xffff] < 0) {
                  printf("Oops: found point %u not on grid:");
                  lVar49 = 4;
                  do {
                    printf(" %d",(ulong)(uint)(int)*pcVar50);
                    pcVar50 = pcVar50 + 1;
                    lVar49 = lVar49 + -1;
                  } while (lVar49 != 0);
                  putchar(10);
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
                             ,0xe8a,"fatal error");
                }
                *(char *)((long)local_248 + lVar49 + local_358 * 8) = (char)piVar41[uVar53 & 0xffff]
                ;
                lVar49 = lVar49 + 1;
                pcVar50 = pcVar50 + 4;
              } while (lVar49 != 8);
              local_248[local_358 + 0x10] =
                   (local_348[0] >> 0x18) << 0x15 | (local_348[0] >> 0x10 & 0xff) << 0xe |
                   (local_348[0] >> 8 & 0xff) << 7 | local_348[0] & 0xff;
              fVar90 = auVar98._0_4_;
              if (fVar90 < 0.0) {
                pcVar50 = "scale >= 0";
                iVar46 = 0xe95;
                goto LAB_00136b30;
              }
              *(float *)((long)afStack_1c4 + local_358 * 4 + 0x6cU) = fVar90;
              lVar51 = local_2c0;
              if (fVar91 <= fVar90) {
                fVar91 = fVar90;
              }
            }
            else {
              *(undefined4 *)((long)afStack_1c4 + local_358 * 4 + 0x6cU) = 0;
              local_298 = 0;
              uStack_290 = 0;
              local_288 = 0;
              uStack_280 = 0;
            }
            puVar43 = local_2d0;
            lVar49 = local_338;
            auVar93 = _DAT_0014e7d0;
            local_358 = local_358 + 1;
            local_340 = local_340 + 0x80;
            local_2b8 = local_2b8 + 0x80;
          } while (local_358 != 8);
          if ((fVar91 != 0.0) || (NAN(fVar91))) {
            fVar100 = (fVar91 / 31.0) * 1.0125;
            fVar90 = (float)(((uint)fVar100 & 0x7f800000) + 0x7800000);
            if ((uint)((int)fVar100 * 2) < 0x71000000) {
              fVar90 = 2.0;
            }
            fVar90 = fVar90 + ABS(fVar100) * 5.192297e+33 * 7.70372e-34;
            uVar47 = (SUB42(fVar90,0) & 0xfff) + ((ushort)((uint)fVar90 >> 0xd) & 0x7c00);
            if (0xff000000 < (uint)((int)fVar100 * 2)) {
              uVar47 = 0x7e00;
            }
            *(ushort *)local_2e0 = uVar47 | (ushort)((uint)fVar100 >> 0x10) & 0x8000;
            fVar90 = 1.0 / (fVar91 / 31.0);
            lVar44 = 0x10;
            do {
              fVar91 = (*(float *)((long)afStack_1c4 + lVar44 * 4 + 0x2cU) * fVar90 + -1.0) * 0.5 +
                       12582912.0;
              fVar100 = (*(float *)((long)afStack_1c4 + (lVar44 + 1) * 4 + 0x2cU) * fVar90 + -1.0) *
                        0.5 + 12582912.0;
              auVar104._0_8_ = CONCAT44(fVar100,fVar91) & 0x7fffff007fffff;
              auVar104._8_4_ =
                   (uint)((*(float *)((long)afStack_1c4 + (lVar44 + 2) * 4 + 0x2cU) * fVar90 + -1.0)
                          * 0.5 + 12582912.0) & 0x7fffff;
              auVar104._12_4_ =
                   (uint)((*(float *)((long)afStack_1c4 + (lVar44 + 3) * 4 + 0x2cU) * fVar90 + -1.0)
                          * 0.5 + 12582912.0) & 0x7fffff;
              auVar103._0_4_ = -(uint)((int)((uint)fVar91 & 0x7fffff) < auVar93._0_4_);
              auVar103._4_4_ = -(uint)((int)((uint)fVar100 & 0x7fffff) < auVar93._4_4_);
              auVar103._8_4_ = -(uint)((int)auVar104._8_4_ < auVar93._8_4_);
              auVar103._12_4_ = -(uint)((int)auVar104._12_4_ < auVar93._12_4_);
              auVar104 = ~auVar103 & auVar93 | auVar104 & auVar103;
              auVar99._0_4_ = -(uint)(0x400000 < auVar104._0_4_);
              auVar99._4_4_ = -(uint)(0x400000 < auVar104._4_4_);
              auVar99._8_4_ = -(uint)(0x400000 < auVar104._8_4_);
              auVar99._12_4_ = -(uint)(0x400000 < auVar104._12_4_);
              auVar99 = auVar99 & auVar104;
              local_248[lVar44] = auVar99._0_4_ << 0x1c | local_248[lVar44];
              local_248[lVar44 + 1] = auVar99._4_4_ << 0x1c | local_248[lVar44 + 1];
              local_248[lVar44 + 2] = auVar99._8_4_ << 0x1c | local_248[lVar44 + 2];
              local_248[lVar44 + 3] = auVar99._12_4_ << 0x1c | local_248[lVar44 + 3];
              lVar44 = lVar44 + 4;
            } while (lVar44 != 0x18);
            memcpy(local_2d0,local_248,0x60);
            auVar104 = _DAT_0014e9a0;
            auVar99 = _DAT_0014e720;
          }
          else {
            local_2d0[10] = 0;
            local_2d0[0xb] = 0;
            local_2d0[8] = 0;
            local_2d0[9] = 0;
            local_2d0[6] = 0;
            local_2d0[7] = 0;
            local_2d0[4] = 0;
            local_2d0[5] = 0;
            local_2d0[2] = 0;
            local_2d0[3] = 0;
            *local_2d0 = 0;
            local_2d0[1] = 0;
          }
          x = (float *)((long)local_2e0 + 0x62);
          local_2d0 = (undefined8 *)((long)puVar43 + 0x62);
          lVar51 = lVar51 + 1;
          lVar49 = lVar49 + 0x400;
          local_2e8 = local_2e8 + 0x400;
        } while (lVar51 != local_2a8);
      }
      return;
    }
    pcVar50 = "n%QK_K == 0";
    iVar46 = 0xde9;
  }
LAB_00136b30:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c",
             iVar46,"GGML_ASSERT(%s) failed",pcVar50,quant_weights);
}

Assistant:

static void quantize_row_iq3_xxs_impl(int grid_size, const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t n,
        const float * GGML_RESTRICT quant_weights) {

    const int gindex = iq3_data_index(grid_size);

    const uint32_t * kgrid_q3xs      = iq3_data[gindex].grid;
    const int      * kmap_q3xs       = iq3_data[gindex].map;
    const uint16_t * kneighbors_q3xs = iq3_data[gindex].neighbours;

    //GGML_ASSERT(quant_weights   && "missing quantization weights");
    GGML_ASSERT(kgrid_q3xs      && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(kmap_q3xs       && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(kneighbors_q3xs && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(n%QK_K == 0);

    const int kMaxQ = 8;

    const int64_t nbl = n/QK_K;

    ggml_fp16_t * dh;
    uint8_t * qs;
    int block_size;
    if (grid_size == 256) {
        block_iq3_xxs * y = vy;
        dh = &y->d;
        qs = y->qs;
        block_size = sizeof(block_iq3_xxs);
    } else {
        block_iq3_s * y = vy;
        dh = &y->d;
        qs = y->qs;
        block_size = sizeof(block_iq3_s);
    }
    int quant_size = block_size - sizeof(ggml_fp16_t);

    float scales[QK_K/32];
    float weight[32];
    float xval[32];
    int8_t L[32];
    int8_t Laux[32];
    float  waux[32];
    bool   is_on_grid[8];
    bool   is_on_grid_aux[8];
    uint8_t block_signs[8];
    uint8_t q3[3*(QK_K/8)+QK_K/32];
    uint32_t * scales_and_signs = (uint32_t *)(q3 + QK_K/4);
    uint8_t  * qh = q3 + 3*(QK_K/8);

    for (int ibl = 0; ibl < nbl; ++ibl) {

        dh[0] = GGML_FP32_TO_FP16(0.f);
        memset(q3, 0, 3*QK_K/8+QK_K/32);

        float max_scale = 0;

        const float * xbl = x + QK_K*ibl;
        float sumx2 = 0;
        for (int i = 0; i < QK_K; ++i) sumx2 += xbl[i]*xbl[i];
        float sigma2 = 2*sumx2/QK_K;

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const float * xb = xbl + 32*ib;
            if (quant_weights) {
                const float * qw = quant_weights + QK_K*ibl + 32*ib;
                for (int i = 0; i < 32; ++i) weight[i] = qw[i] * sqrtf(sigma2 + xb[i]*xb[i]);
            } else {
                for (int i = 0; i < 32; ++i) weight[i] = xb[i]*xb[i];
            }
            for (int i = 0; i < 32; ++i) waux[i] = sqrtf(weight[i]);
            for (int k = 0; k < 4; ++k) {
                int nflip = 0;
                uint8_t s = 0;
                for (int i = 0; i < 8; ++i) {
                    if (xb[8*k + i] >= 0) xval[8*k + i] = xb[8*k + i];
                    else {
                        xval[8*k + i] = -xb[8*k + i]; ++nflip; s |= (1 << i);
                    }
                }
                if (nflip%2) {
                    int imin = 0; float min = weight[8*k+imin]*xb[8*k+imin]*xb[8*k+imin];
                    for (int i = 1; i < 8; ++i) {
                        float ax = weight[8*k+i]*xb[8*k+i]*xb[8*k+i];
                        if (ax < min) {
                            min = ax; imin = i;
                        }
                    }
                    xval[8*k+imin] = -xval[8*k+imin];
                    s ^= (1 << imin);
                }
                block_signs[k] = s & 127;
            }
            float max = xval[0];
            for (int i = 1; i < 32; ++i) max = MAX(max, xval[i]);
            if (max < GROUP_MAX_EPS_IQ3_XXS) {
                scales[ib] = 0;
                memset(L, 0, 32);
                continue;
            }
            float best = 0;
            float scale = max/(2*kMaxQ-1);
            for (int is = -15; is <= 15; ++is) {
                float id = (2*kMaxQ-1+is*0.2f)/max;
                float this_scale = 1/id;
                for (int k = 0; k < 8; ++k) {
                    for (int i = 0; i < 4; ++i) {
                        int l = nearest_int(0.5f*(id*xval[4*k+i]-1));
                        Laux[4*k+i] = MAX(0, MIN(kMaxQ-1, l));
                    }
                    uint16_t u = 0;
                    for (int i = 0; i < 4; ++i) u |= (Laux[4*k+i] << 3*i);
                    int grid_index = kmap_q3xs[u];
                    is_on_grid_aux[k] = true;
                    if (grid_index < 0) {
                        is_on_grid_aux[k] = false;
                        const uint16_t * neighbours = kneighbors_q3xs - kmap_q3xs[u] - 1;
                        grid_index = iq3_find_best_neighbour(neighbours, kgrid_q3xs, xval + 4*k, waux + 4*k, this_scale, Laux + 4*k);
                    }
                }
                float sumqx = 0, sumq2 = 0;
                for (int i = 0; i < 32; ++i) {
                    float w = weight[i];
                    float q = 2*Laux[i] + 1;
                    sumqx += w*xval[i]*q;
                    sumq2 += w*q*q;
                }
                if (sumq2 > 0 && sumqx*sumqx > best*sumq2) {
                    scale = sumqx/sumq2; best = scale*sumqx;
                    for (int i = 0; i < 32; ++i) L[i] = Laux[i];
                    for (int k = 0; k <  8; ++k) is_on_grid[k] = is_on_grid_aux[k];
                }
            }
            int n_not_ongrid = 0;
            for (int k = 0; k < 8; ++k) if (!is_on_grid[k]) ++n_not_ongrid;
            if (n_not_ongrid > 0 && scale > 0) {
                float id = 1/scale;
                for (int k = 0; k < 8; ++k) {
                    if (is_on_grid[k]) continue;
                    uint16_t u = 0;
                    for (int i = 0; i < 4; ++i) {
                        int l = nearest_int(0.5f*(id*xval[4*k+i]-1));
                        l = MAX(0, MIN(kMaxQ-1, l));
                        u |= (l << 3*i);
                    }
                    int grid_index = kmap_q3xs[u];
                    if (grid_index < 0) {
                        const uint16_t * neighbours = kneighbors_q3xs - kmap_q3xs[u] - 1;
                        grid_index = iq3_find_best_neighbour(neighbours, kgrid_q3xs, xval + 4*k, waux + 4*k, scale, L + 4*k);
                    }
                    const int8_t * pg = (const int8_t *)(kgrid_q3xs + grid_index);
                    for (int i = 0; i < 4; ++i) L[4*k+i] = (pg[i] - 1)/2;
                }
                float sumqx = 0, sumq2 = 0;
                for (int i = 0; i < 32; ++i) {
                    float w = weight[i];
                    float q = 2*L[i] + 1;
                    sumqx += w*xval[i]*q;
                    sumq2 += w*q*q;
                }
                if (sumq2 > 0) scale = sumqx/sumq2;
            }
            if (scale < 0) {
                // This should never happen, but just in case, flip scale so that it is positive (we use uint's to encode the scale)
                // and correspondingly flip quant signs.
                scale = -scale;
                for (int k = 0; k < 4; ++k) block_signs[k] = (~block_signs[k]) & 127;
            }
            for (int k = 0; k < 8; ++k) {
                uint16_t u = 0;
                for (int i = 0; i < 4; ++i) u |= (L[4*k+i] << 3*i);
                int grid_index = kmap_q3xs[u];
                if (grid_index < 0) {
                    printf("Oops: found point %u not on grid:", u);
                    for (int i = 0; i < 4; ++i) printf(" %d", L[4*k+i]);
                    printf("\n");
                    GGML_ABORT("fatal error");
                }
                if (grid_size == 256) {
                    q3[8*ib+k] = grid_index;
                } else {
                    q3[8*ib+k] = grid_index & 255;
                    qh[ib] |= ((grid_index >> 8) << k);
                }

            }
            scales_and_signs[ib] = block_signs[0] | (block_signs[1] << 7) | (block_signs[2] << 14) | (block_signs[3] << 21);
            GGML_ASSERT(scale >= 0);
            scales[ib] = scale;
            max_scale = MAX(max_scale, scale);
        }

        if (!max_scale) {
            memset(qs, 0, quant_size);
            dh += block_size/sizeof(ggml_fp16_t);
            qs += block_size;
            continue;
        }

        float d = max_scale/31;
        dh[0] = GGML_FP32_TO_FP16(d * 1.0125f);  // small improvement via this fudge factor
        float id = 1/d;
        for (int ib = 0; ib < QK_K/32; ++ib) {
            int l = nearest_int(0.5f*(id*scales[ib]-1));
            l = MAX(0, MIN(15, l));
            scales_and_signs[ib] |= ((uint32_t)l << 28);
        }
        memcpy(qs, q3, quant_size);

        dh += block_size/sizeof(ggml_fp16_t);
        qs += block_size;

    }
}